

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall
wasm::TranslateToFuzzReader::makeCompoundRef(TranslateToFuzzReader *this,Type type)

{
  int iVar1;
  uintptr_t *puVar2;
  bool bVar3;
  char cVar4;
  undefined4 uVar5;
  uint32_t x;
  HeapType HVar6;
  StructNew *pSVar7;
  mapped_type *pmVar8;
  long *plVar9;
  Const *size;
  Expression *pEVar10;
  uint uVar11;
  Field *field;
  long lVar12;
  uintptr_t *puVar13;
  char *pcVar14;
  anon_class_8_1_8991fb9c aVar15;
  int iVar16;
  long lVar17;
  TranslateToFuzzReader *pTVar18;
  Expression *local_88;
  uintptr_t uStack_80;
  anon_class_8_1_8991fb9c local_78;
  anon_class_8_1_8991fb9c makeChild;
  undefined1 auStack_68 [8];
  Field element;
  HeapType heapType;
  Type type_local;
  
  heapType.id = type.id;
  if ((type.id < 7) || ((type.id & 1) != 0)) {
    __assert_fail("type.isRef()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0xdf3,"Expression *wasm::TranslateToFuzzReader::makeCompoundRef(Type)");
  }
  HVar6 = Type::getHeapType((Type *)&heapType);
  if (HVar6.id < 0x7d) {
    __assert_fail("!heapType.isBasic()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0xdf5,"Expression *wasm::TranslateToFuzzReader::makeCompoundRef(Type)");
  }
  if (((this->wasm->features).features & 0x100) == 0) {
    __assert_fail("wasm.features.hasReferenceTypes()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0xdf6,"Expression *wasm::TranslateToFuzzReader::makeCompoundRef(Type)");
  }
  iVar16 = (this->fuzzParams->super_FuzzParams).NESTING_LIMIT;
  iVar1 = this->nesting;
  this->nesting = iVar1 + 1;
  if ((((uint)heapType.id & 3) == 2 && 6 < heapType.id) &&
     ((iVar16 <= iVar1 || (this->random).finishedInput != false ||
      (bVar3 = Random::oneIn(&this->random,(iVar16 - iVar1) + 1), bVar3)))) {
    pSVar7 = (StructNew *)Builder::makeRefNull(&this->builder,HVar6);
  }
  else {
    if (((heapType.id & 3) != 0 || heapType.id < 7) ||
       ((((this->random).finishedInput == false && (this->nesting <= iVar16)) ||
        (this->funcContext == (FunctionCreationContext *)0x0)))) {
      local_78.this = this;
      uVar5 = ::wasm::HeapType::getKind();
      switch(uVar5) {
      case 1:
        pSVar7 = (StructNew *)makeRefFuncConst(this,(Type)heapType.id);
        goto LAB_001645e8;
      case 2:
        plVar9 = (long *)::wasm::HeapType::getStruct();
        element.packedType = not_packed;
        element.mutable_ = Immutable;
        auStack_68 = (undefined1  [8])0x0;
        element.type.id = 0;
        pTVar18 = (TranslateToFuzzReader *)*plVar9;
        makeChild.this = (TranslateToFuzzReader *)plVar9[1];
        lVar12 = (long)makeChild.this - (long)pTVar18;
        for (lVar17 = lVar12 >> 6; aVar15.this = pTVar18, 0 < lVar17; lVar17 = lVar17 + -1) {
          cVar4 = ::wasm::Type::isDefaultable();
          if (cVar4 == '\0') goto LAB_0016478b;
          cVar4 = ::wasm::Type::isDefaultable();
          aVar15.this = (TranslateToFuzzReader *)&pTVar18->builder;
          if (cVar4 == '\0') goto LAB_0016478b;
          cVar4 = ::wasm::Type::isDefaultable();
          aVar15.this = (TranslateToFuzzReader *)
                        &(pTVar18->random).bytes.super__Vector_base<char,_std::allocator<char>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
          if (cVar4 == '\0') goto LAB_0016478b;
          cVar4 = ::wasm::Type::isDefaultable();
          aVar15.this = (TranslateToFuzzReader *)&(pTVar18->random).pos;
          if (cVar4 == '\0') goto LAB_0016478b;
          pTVar18 = (TranslateToFuzzReader *)&(pTVar18->random).features;
          lVar12 = lVar12 + -0x40;
        }
        lVar12 = lVar12 >> 4;
        if (lVar12 == 1) {
LAB_00164865:
          cVar4 = ::wasm::Type::isDefaultable();
          aVar15.this = pTVar18;
          if (cVar4 != '\0') {
            aVar15 = makeChild;
          }
LAB_0016478b:
          if (aVar15.this == makeChild.this) goto LAB_00164791;
LAB_001647a5:
          puVar2 = (uintptr_t *)plVar9[1];
          for (puVar13 = (uintptr_t *)*plVar9; puVar13 != puVar2; puVar13 = puVar13 + 2) {
            local_88 = makeCompoundRef::anon_class_8_1_8991fb9c::operator()
                                 (&local_78,(Type)*puVar13);
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            emplace_back<wasm::Expression*>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_68,
                       &local_88);
          }
          if (auStack_68 == (undefined1  [8])element.type.id) goto LAB_0016480d;
          iVar16 = (int)((long)(element.type.id - (long)auStack_68) >> 3);
          this->nesting = this->nesting + iVar16 + -1;
        }
        else {
          if (lVar12 == 2) {
LAB_0016484f:
            cVar4 = ::wasm::Type::isDefaultable();
            aVar15.this = pTVar18;
            if (cVar4 != '\0') {
              pTVar18 = (TranslateToFuzzReader *)&pTVar18->builder;
              goto LAB_00164865;
            }
            goto LAB_0016478b;
          }
          if (lVar12 == 3) {
            cVar4 = ::wasm::Type::isDefaultable();
            if (cVar4 != '\0') {
              pTVar18 = (TranslateToFuzzReader *)&pTVar18->builder;
              goto LAB_0016484f;
            }
            goto LAB_0016478b;
          }
LAB_00164791:
          bVar3 = Random::oneIn(&this->random,2);
          if (bVar3) goto LAB_001647a5;
LAB_0016480d:
          iVar16 = 1;
        }
        pSVar7 = Builder::
                 makeStructNew<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                           (&this->builder,HVar6,
                            (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                            auStack_68);
        std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
                  ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                   auStack_68);
        goto LAB_00164832;
      case 3:
        ::wasm::HeapType::getArray();
        auStack_68 = (undefined1  [8])local_88;
        element.type.id = uStack_80;
        cVar4 = ::wasm::Type::isDefaultable();
        if ((cVar4 == '\0') || (bVar3 = Random::oneIn(&this->random,2), bVar3)) {
          pEVar10 = makeCompoundRef::anon_class_8_1_8991fb9c::operator()(&local_78,(Type)auStack_68)
          ;
        }
        else {
          pEVar10 = (Expression *)0x0;
        }
        x = Random::upTo(&this->random,(this->fuzzParams->super_FuzzParams).MAX_ARRAY_SIZE);
        size = Builder::makeConst<int>(&this->builder,x);
        HVar6 = Type::getHeapType((Type *)&heapType);
        pSVar7 = (StructNew *)Builder::makeArrayNew(&this->builder,HVar6,(Expression *)size,pEVar10)
        ;
        iVar16 = 1;
        goto LAB_00164832;
      case 4:
        uVar11 = 0xe4e;
        pcVar14 = "TODO: cont";
        break;
      default:
        uVar11 = 0xe52;
        pcVar14 = "unexpected kind";
      }
      ::wasm::handle_unreachable
                (pcVar14,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,uVar11);
    }
    pmVar8 = std::__detail::
             _Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->funcContext->typeLocals,(key_type *)&heapType);
    if ((pmVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_start ==
        (pmVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      pEVar10 = (Expression *)Builder::makeRefNull(&this->builder,HVar6);
      pSVar7 = (StructNew *)Builder::makeRefAs(&this->builder,RefAsNonNull,pEVar10);
    }
    else {
      pSVar7 = (StructNew *)makeLocalGet(this,(Type)heapType.id);
    }
  }
LAB_001645e8:
  iVar16 = 1;
LAB_00164832:
  this->nesting = this->nesting - iVar16;
  return (Expression *)pSVar7;
}

Assistant:

Expression* TranslateToFuzzReader::makeCompoundRef(Type type) {
  assert(type.isRef());
  auto heapType = type.getHeapType();
  assert(!heapType.isBasic());
  assert(wasm.features.hasReferenceTypes());

  // Prefer not to emit a null, in general, as we can trap from them. If it is
  // nullable, give a small chance to do so; if we hit the nesting limit then we
  // really have no choice and must emit a null (or else we could infinitely
  // recurse). For the nesting limit, use a bound that is higher than the normal
  // one, so that the normal mechanisms should prevent us from getting here;
  // this limit is really a last resort we want to never reach. Also, increase
  // the chance to emit a null as |nesting| rises, to avoid deep recursive
  // structures.
  //
  // Note that we might have cycles of types where some are non-nullable. We
  // will only stop here when we exceed the nesting and reach a nullable one.
  // (This assumes there is a nullable one, that is, that the types are
  // inhabitable.)
  const auto LIMIT = fuzzParams->NESTING_LIMIT + 1;
  AutoNester nester(*this);
  if (type.isNullable() &&
      (random.finished() || nesting >= LIMIT || oneIn(LIMIT - nesting + 1))) {
    return builder.makeRefNull(heapType);
  }

  // If the type is non-nullable, but we've run out of input, then we need to do
  // something here to avoid infinite recursion. In the worse case we'll emit a
  // cast to non-null of a null, which validates, but it will trap at runtime
  // which is not ideal.
  if (type.isNonNullable() && (random.finished() || nesting >= LIMIT)) {
    // If we have a function context then we can at least emit a local.get,
    // sometimes, which is less bad. Note that we need to check typeLocals
    // manually here to avoid infinite recursion (as makeLocalGet will fall back
    // to us, if there is no local).
    // TODO: we could also look for locals containing subtypes
    if (funcContext) {
      if (!funcContext->typeLocals[type].empty()) {
        return makeLocalGet(type);
      }
      // No local, but we are in a function context so RefAsNonNull is valid.
      return builder.makeRefAs(RefAsNonNull, builder.makeRefNull(heapType));
    }
    // No function context, so we are in quite the pickle. Continue onwards, as
    // we may succeed to emit something more complex (like a struct.new).
  }

  // When we make children, they must be trivial if we are not in a function
  // context.
  auto makeChild = [&](Type type) {
    return funcContext ? make(type) : makeTrivial(type);
  };

  switch (heapType.getKind()) {
    case HeapTypeKind::Func:
      return makeRefFuncConst(type);
    case HeapTypeKind::Struct: {
      auto& fields = heapType.getStruct().fields;
      std::vector<Expression*> values;
      // If there is a nondefaultable field, we must provide the value and not
      // depend on defaults. Also do that randomly half the time.
      if (std::any_of(
            fields.begin(),
            fields.end(),
            [&](const Field& field) { return !field.type.isDefaultable(); }) ||
          oneIn(2)) {
        for (auto& field : fields) {
          values.push_back(makeChild(field.type));
        }
        // Add more nesting manually, as we can easily get exponential blowup
        // here. This nesting makes it much less likely for a recursive data
        // structure to end up as a massive tree of struct.news, since the
        // nesting limitation code at the top of this function will kick in.
        if (!values.empty()) {
          // Subtract 1 since if there is a single value there cannot be
          // exponential blowup.
          nester.add(values.size() - 1);
        }
      }
      return builder.makeStructNew(heapType, values);
    }
    case HeapTypeKind::Array: {
      auto element = heapType.getArray().element;
      Expression* init = nullptr;
      if (!element.type.isDefaultable() || oneIn(2)) {
        init = makeChild(element.type);
      }
      auto* count =
        builder.makeConst(int32_t(upTo(fuzzParams->MAX_ARRAY_SIZE)));
      return builder.makeArrayNew(type.getHeapType(), count, init);
    }
    case HeapTypeKind::Cont:
      WASM_UNREACHABLE("TODO: cont");
    case HeapTypeKind::Basic:
      break;
  }
  WASM_UNREACHABLE("unexpected kind");
}